

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::
SubscriptionSyncTest_test_to_string_when_all_subjects_have_controls_Test::
~SubscriptionSyncTest_test_to_string_when_all_subjects_have_controls_Test
          (SubscriptionSyncTest_test_to_string_when_all_subjects_have_controls_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_to_string_when_all_subjects_have_controls)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);

    subscription_sync.AddControl(0, ControlOperationEnum::TOGGLE);
    subscription_sync.AddControl(1, ControlOperationEnum::REFRESH);

    ASSERT_EQ("SubscriptionSync(edition=123, compressed=false, controls=2, changed=true, subjects=2) [\n"
                 "  Quantity=2500000,Symbol=EURGBP (TOGGLE)\n"
                 "  Quantity=5600000,Symbol=USDJPY (REFRESH)\n"
                 "]", subscription_sync.ToString());
}